

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# left_right_sequence.h
# Opt level: O2

void __thiscall
bk_lib::detail::left_right_rep<Clasp::Literal,_std::pair<Clasp::Literal,_Clasp::Literal>_>::clear
          (left_right_rep<Clasp::Literal,_std::pair<Clasp::Literal,_Clasp::Literal>_> *this,
          bool releaseMem)

{
  uint uVar1;
  undefined3 in_register_00000031;
  
  if (CONCAT31(in_register_00000031,releaseMem) == 0) {
    uVar1 = *(uint *)&this->field_0x8 & 0x7fffffff;
  }
  else {
    release(this);
    this->buf_ = (buf_type *)0x0;
    *(undefined4 *)&this->field_0x8 = 0;
    uVar1 = 0;
  }
  this->left_ = 0;
  this->right_ = uVar1;
  return;
}

Assistant:

void clear(bool releaseMem = false) {
		if (releaseMem) {
			release();
			buf_  = 0;
			cap_  = 0;
			free_ = 0;
		}
		left_ = 0;
		right_= cap_;
	}